

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O2

_Bool is_options_valid(lzma_options_lzma *options)

{
  _Bool _Var1;
  
  _Var1 = is_lclppb_valid(options);
  if ((_Var1) && (options->nice_len - 2 < 0x110)) {
    _Var1 = options->mode - LZMA_MODE_FAST < 2;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool
is_options_valid(const lzma_options_lzma *options)
{
	// Validate some of the options. LZ encoder validates nice_len too
	// but we need a valid value here earlier.
	return is_lclppb_valid(options)
			&& options->nice_len >= MATCH_LEN_MIN
			&& options->nice_len <= MATCH_LEN_MAX
			&& (options->mode == LZMA_MODE_FAST
				|| options->mode == LZMA_MODE_NORMAL);
}